

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O2

void __thiscall Room::shuffleTiles(Room *this)

{
  ulong uVar1;
  int iVar2;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_10;
  
  uVar1 = std::chrono::_V2::system_clock::now();
  iVar2 = (int)((uVar1 & 0xffffffff) % 0x7fffffff);
  local_10._M_x = (unsigned_long)(iVar2 + (uint)(iVar2 == 0));
  std::shuffle<Tile*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            ((this->tiles)._M_elems,(Tile *)(this + 1),&local_10);
  return;
}

Assistant:

void Room::shuffleTiles() {
    unsigned seed = std::chrono::system_clock::now().time_since_epoch().count();
    shuffle(tiles.begin(), tiles.end(), std::default_random_engine(seed));
}